

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeSymbol.cpp
# Opt level: O0

span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>
slang::ast::AttributeSymbol::fromSyntax
          (span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax,
          Scope *scope,LookupLocation lookupLocation)

{
  bool bVar1;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar2;
  anon_class_16_2_e52d6572 *in_stack_00000360;
  Scope *in_stack_00000368;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
  in_stack_00000370;
  undefined1 local_10 [16];
  
  bVar1 = std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
          empty((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *
                )0xa53507);
  if (bVar1) {
    std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::span
              ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)0xa53517);
  }
  else {
    local_10 = (undefined1  [16])
               createAttributes<slang::ast::AttributeSymbol::fromSyntax(std::span<slang::syntax::AttributeInstanceSyntax_const*const,18446744073709551615ul>,slang::ast::Scope_const&,slang::ast::LookupLocation)::__0>
                         (in_stack_00000370,in_stack_00000368,in_stack_00000360);
  }
  sVar2._M_ptr = (pointer)local_10._0_8_;
  sVar2._M_extent._M_extent_value = local_10._8_8_;
  return sVar2;
}

Assistant:

std::span<const AttributeSymbol* const> AttributeSymbol::fromSyntax(
    std::span<const AttributeInstanceSyntax* const> syntax, const Scope& scope,
    LookupLocation lookupLocation) {

    if (syntax.empty())
        return {};

    return createAttributes(
        syntax, scope,
        [&scope, &lookupLocation](auto& comp, auto name, auto loc, auto& exprSyntax) {
            return comp.template emplace<AttributeSymbol>(name, loc, scope, lookupLocation,
                                                          exprSyntax);
        });
}